

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 *puVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ulong uVar12;
  undefined8 uVar13;
  Scene *pSVar14;
  float **ppfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  Geometry *pGVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar27;
  int iVar28;
  undefined4 uVar29;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar30;
  long lVar31;
  RTCRayN *pRVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar61;
  float fVar62;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar72;
  float fVar79;
  float fVar80;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar75;
  float fVar81;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  float fVar90;
  float fVar91;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar86;
  float fVar92;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar93;
  float fVar98;
  float fVar99;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar100;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar101;
  float fVar106;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar105;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar113;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar118 [16];
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar125 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar143 [16];
  UVIdentity<4> mapUV;
  Scene *scene;
  vbool<4> valid;
  undefined1 local_1278 [16];
  undefined1 (*local_1268) [16];
  long local_1260;
  long local_1258;
  ulong local_1250;
  RTCFilterFunctionNArguments args;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  vfloat<4> tNear;
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  float local_1178 [4];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined1 local_10b8 [16];
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  undefined8 local_1018;
  undefined8 uStack_1010;
  RTCHitN local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 uStack_fd0;
  undefined4 uStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar30 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar133 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar92 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar100 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar129 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar134 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar139 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar141 = fVar129 * 0.99999964;
  fVar108 = fVar134 * 0.99999964;
  fVar140 = fVar139 * 0.99999964;
  fVar129 = fVar129 * 1.0000004;
  fVar134 = fVar134 * 1.0000004;
  fVar139 = fVar139 * 1.0000004;
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1250 = uVar37 ^ 0x10;
  iVar28 = (tray->tnear).field_0.i[k];
  auVar114._4_4_ = iVar28;
  auVar114._0_4_ = iVar28;
  auVar114._8_4_ = iVar28;
  auVar114._12_4_ = iVar28;
  iVar28 = (tray->tfar).field_0.i[k];
  auVar52._4_4_ = iVar28;
  auVar52._0_4_ = iVar28;
  auVar52._8_4_ = iVar28;
  auVar52._12_4_ = iVar28;
  local_1268 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_10c8 = fVar133;
  fStack_10c4 = fVar133;
  fStack_10c0 = fVar133;
  fStack_10bc = fVar133;
  local_10d8 = fVar92;
  fStack_10d4 = fVar92;
  fStack_10d0 = fVar92;
  fStack_10cc = fVar92;
  local_10e8 = fVar100;
  fStack_10e4 = fVar100;
  fStack_10e0 = fVar100;
  fStack_10dc = fVar100;
  local_10f8 = fVar129;
  fStack_10f4 = fVar129;
  fStack_10f0 = fVar129;
  fStack_10ec = fVar129;
  local_1108 = fVar134;
  fStack_1104 = fVar134;
  fStack_1100 = fVar134;
  fStack_10fc = fVar134;
  local_1118 = fVar139;
  fStack_1114 = fVar139;
  fStack_1110 = fVar139;
  fStack_110c = fVar139;
  local_1128 = fVar140;
  fStack_1124 = fVar140;
  fStack_1120 = fVar140;
  fStack_111c = fVar140;
  local_1138 = fVar141;
  fStack_1134 = fVar141;
  fStack_1130 = fVar141;
  fStack_112c = fVar141;
  fVar121 = fVar141;
  fVar120 = fVar141;
  fVar119 = fVar141;
  fVar117 = fVar100;
  fVar116 = fVar100;
  fVar113 = fVar100;
  fVar109 = fVar92;
  fVar107 = fVar92;
  fVar106 = fVar92;
  fVar101 = fVar140;
  fVar99 = fVar140;
  fVar98 = fVar140;
  fVar93 = fVar139;
  fVar91 = fVar139;
  fVar90 = fVar139;
  fVar82 = fVar134;
  fVar81 = fVar134;
  fVar80 = fVar134;
  fVar79 = fVar129;
  fVar72 = fVar129;
  fVar71 = fVar129;
  fVar70 = fVar133;
  fVar69 = fVar133;
  fVar62 = fVar133;
LAB_00258958:
  do {
    pSVar27 = pSVar30 + -1;
    pSVar30 = pSVar30 + -1;
    if ((float)pSVar27->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar27->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar35 = (pSVar30->ptr).ptr;
      while ((uVar35 & 8) == 0) {
        pfVar8 = (float *)(uVar35 + 0x20 + uVar37);
        auVar42._0_4_ = (*pfVar8 - fVar62) * fVar119;
        auVar42._4_4_ = (pfVar8[1] - fVar69) * fVar120;
        auVar42._8_4_ = (pfVar8[2] - fVar70) * fVar121;
        auVar42._12_4_ = (pfVar8[3] - fVar133) * fVar141;
        pfVar8 = (float *)(uVar35 + 0x20 + uVar36);
        auVar103._0_4_ = (*pfVar8 - fVar106) * fVar108;
        auVar103._4_4_ = (pfVar8[1] - fVar107) * fVar108;
        auVar103._8_4_ = (pfVar8[2] - fVar109) * fVar108;
        auVar103._12_4_ = (pfVar8[3] - fVar92) * fVar108;
        auVar42 = maxps(auVar42,auVar103);
        pfVar8 = (float *)(uVar35 + 0x20 + uVar38);
        auVar104._0_4_ = (*pfVar8 - fVar113) * fVar98;
        auVar104._4_4_ = (pfVar8[1] - fVar116) * fVar99;
        auVar104._8_4_ = (pfVar8[2] - fVar117) * fVar101;
        auVar104._12_4_ = (pfVar8[3] - fVar100) * fVar140;
        auVar73 = maxps(auVar104,auVar114);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar42,auVar73);
        pfVar8 = (float *)(uVar35 + 0x20 + local_1250);
        auVar111._0_4_ = (*pfVar8 - fVar62) * fVar71;
        auVar111._4_4_ = (pfVar8[1] - fVar69) * fVar72;
        auVar111._8_4_ = (pfVar8[2] - fVar70) * fVar79;
        auVar111._12_4_ = (pfVar8[3] - fVar133) * fVar129;
        pfVar8 = (float *)(uVar35 + 0x20 + (uVar36 ^ 0x10));
        auVar83._0_4_ = (*pfVar8 - fVar106) * fVar80;
        auVar83._4_4_ = (pfVar8[1] - fVar107) * fVar81;
        auVar83._8_4_ = (pfVar8[2] - fVar109) * fVar82;
        auVar83._12_4_ = (pfVar8[3] - fVar92) * fVar134;
        auVar42 = minps(auVar111,auVar83);
        pfVar8 = (float *)(uVar35 + 0x20 + (uVar38 ^ 0x10));
        auVar84._0_4_ = (*pfVar8 - fVar113) * fVar90;
        auVar84._4_4_ = (pfVar8[1] - fVar116) * fVar91;
        auVar84._8_4_ = (pfVar8[2] - fVar117) * fVar93;
        auVar84._12_4_ = (pfVar8[3] - fVar100) * fVar139;
        auVar73 = minps(auVar84,auVar52);
        auVar42 = minps(auVar42,auVar73);
        auVar73._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar42._4_4_);
        auVar73._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar42._0_4_);
        auVar73._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar42._8_4_);
        auVar73._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar42._12_4_);
        uVar34 = movmskps((int)local_1250,auVar73);
        if (uVar34 == 0) {
          if (pSVar30 == stack) {
            return;
          }
          goto LAB_00258958;
        }
        uVar34 = uVar34 & 0xff;
        uVar33 = uVar35 & 0xfffffffffffffff0;
        lVar31 = 0;
        if (uVar34 != 0) {
          for (; (uVar34 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
          }
        }
        uVar35 = *(ulong *)(uVar33 + lVar31 * 8);
        uVar34 = uVar34 - 1 & uVar34;
        if (uVar34 != 0) {
          uVar39 = tNear.field_0.i[lVar31];
          lVar31 = 0;
          if (uVar34 != 0) {
            for (; (uVar34 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
            }
          }
          uVar12 = *(ulong *)(uVar33 + lVar31 * 8);
          uVar40 = tNear.field_0.i[lVar31];
          uVar34 = uVar34 - 1 & uVar34;
          if (uVar34 == 0) {
            if (uVar39 < uVar40) {
              (pSVar30->ptr).ptr = uVar12;
              pSVar30->dist = uVar40;
              pSVar30 = pSVar30 + 1;
            }
            else {
              (pSVar30->ptr).ptr = uVar35;
              pSVar30->dist = uVar39;
              pSVar30 = pSVar30 + 1;
              uVar35 = uVar12;
            }
          }
          else {
            auVar74._8_4_ = uVar39;
            auVar74._0_8_ = uVar35;
            auVar74._12_4_ = 0;
            auVar94._8_4_ = uVar40;
            auVar94._0_8_ = uVar12;
            auVar94._12_4_ = 0;
            lVar31 = 0;
            if (uVar34 != 0) {
              for (; (uVar34 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            uVar13 = *(undefined8 *)(uVar33 + lVar31 * 8);
            iVar28 = tNear.field_0.i[lVar31];
            auVar85._8_4_ = iVar28;
            auVar85._0_8_ = uVar13;
            auVar85._12_4_ = 0;
            auVar43._8_4_ = -(uint)((int)uVar39 < (int)uVar40);
            uVar34 = uVar34 - 1 & uVar34;
            if (uVar34 == 0) {
              auVar43._4_4_ = auVar43._8_4_;
              auVar43._0_4_ = auVar43._8_4_;
              auVar43._12_4_ = auVar43._8_4_;
              auVar102._8_4_ = uVar40;
              auVar102._0_8_ = uVar12;
              auVar102._12_4_ = 0;
              auVar103 = blendvps(auVar102,auVar74,auVar43);
              auVar42 = blendvps(auVar74,auVar94,auVar43);
              auVar44._8_4_ = -(uint)(auVar103._8_4_ < iVar28);
              auVar44._4_4_ = auVar44._8_4_;
              auVar44._0_4_ = auVar44._8_4_;
              auVar44._12_4_ = auVar44._8_4_;
              auVar95._8_4_ = iVar28;
              auVar95._0_8_ = uVar13;
              auVar95._12_4_ = 0;
              auVar73 = blendvps(auVar95,auVar103,auVar44);
              auVar103 = blendvps(auVar103,auVar85,auVar44);
              auVar45._8_4_ = -(uint)(auVar42._8_4_ < auVar103._8_4_);
              auVar45._4_4_ = auVar45._8_4_;
              auVar45._0_4_ = auVar45._8_4_;
              auVar45._12_4_ = auVar45._8_4_;
              SVar86 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar103,auVar42,auVar45);
              SVar75 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar42,auVar103,auVar45);
              *pSVar30 = SVar75;
              pSVar30[1] = SVar86;
              uVar35 = auVar73._0_8_;
              pSVar30 = pSVar30 + 2;
            }
            else {
              lVar31 = 0;
              if (uVar34 != 0) {
                for (; (uVar34 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              auVar46._4_4_ = auVar43._8_4_;
              auVar46._0_4_ = auVar43._8_4_;
              auVar46._8_4_ = auVar43._8_4_;
              auVar46._12_4_ = auVar43._8_4_;
              auVar104 = blendvps(auVar94,auVar74,auVar46);
              auVar42 = blendvps(auVar74,auVar94,auVar46);
              auVar110._8_4_ = tNear.field_0.i[lVar31];
              auVar110._0_8_ = *(undefined8 *)(uVar33 + lVar31 * 8);
              auVar110._12_4_ = 0;
              auVar47._8_4_ = -(uint)(iVar28 < tNear.field_0.i[lVar31]);
              auVar47._4_4_ = auVar47._8_4_;
              auVar47._0_4_ = auVar47._8_4_;
              auVar47._12_4_ = auVar47._8_4_;
              auVar103 = blendvps(auVar110,auVar85,auVar47);
              auVar73 = blendvps(auVar85,auVar110,auVar47);
              auVar48._8_4_ = -(uint)(auVar42._8_4_ < auVar73._8_4_);
              auVar48._4_4_ = auVar48._8_4_;
              auVar48._0_4_ = auVar48._8_4_;
              auVar48._12_4_ = auVar48._8_4_;
              auVar111 = blendvps(auVar73,auVar42,auVar48);
              SVar75 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar42,auVar73,auVar48);
              auVar49._8_4_ = -(uint)(auVar104._8_4_ < auVar103._8_4_);
              auVar49._4_4_ = auVar49._8_4_;
              auVar49._0_4_ = auVar49._8_4_;
              auVar49._12_4_ = auVar49._8_4_;
              auVar42 = blendvps(auVar103,auVar104,auVar49);
              auVar73 = blendvps(auVar104,auVar103,auVar49);
              auVar50._8_4_ = -(uint)(auVar73._8_4_ < auVar111._8_4_);
              auVar50._4_4_ = auVar50._8_4_;
              auVar50._0_4_ = auVar50._8_4_;
              auVar50._12_4_ = auVar50._8_4_;
              SVar86 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar111,auVar73,auVar50);
              SVar105 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar73,auVar111,auVar50);
              *pSVar30 = SVar75;
              pSVar30[1] = SVar105;
              pSVar30[2] = SVar86;
              uVar35 = auVar42._0_8_;
              pSVar30 = pSVar30 + 3;
            }
          }
        }
      }
      local_1260 = (ulong)((uint)uVar35 & 0xf) - 8;
      if (local_1260 != 0) {
        uVar35 = uVar35 & 0xfffffffffffffff0;
        local_1258 = 0;
        do {
          lVar31 = local_1258 * 0x50;
          pSVar14 = context->scene;
          ppfVar15 = (pSVar14->vertices).items;
          pfVar16 = ppfVar15[*(uint *)(uVar35 + 0x30 + lVar31)];
          pfVar8 = pfVar16 + *(uint *)(uVar35 + lVar31);
          pfVar1 = pfVar16 + *(uint *)(uVar35 + 0x10 + lVar31);
          pfVar16 = pfVar16 + *(uint *)(uVar35 + 0x20 + lVar31);
          pfVar17 = ppfVar15[*(uint *)(uVar35 + 0x34 + lVar31)];
          pfVar2 = pfVar17 + *(uint *)(uVar35 + 4 + lVar31);
          pfVar3 = pfVar17 + *(uint *)(uVar35 + 0x14 + lVar31);
          pfVar17 = pfVar17 + *(uint *)(uVar35 + 0x24 + lVar31);
          pfVar18 = ppfVar15[*(uint *)(uVar35 + 0x38 + lVar31)];
          pfVar4 = pfVar18 + *(uint *)(uVar35 + 8 + lVar31);
          pfVar5 = pfVar18 + *(uint *)(uVar35 + 0x18 + lVar31);
          pfVar18 = pfVar18 + *(uint *)(uVar35 + 0x28 + lVar31);
          pfVar19 = ppfVar15[*(uint *)(uVar35 + 0x3c + lVar31)];
          pfVar6 = pfVar19 + *(uint *)(uVar35 + 0xc + lVar31);
          pfVar7 = pfVar19 + *(uint *)(uVar35 + 0x1c + lVar31);
          pfVar19 = pfVar19 + *(uint *)(uVar35 + 0x2c + lVar31);
          puVar9 = (undefined8 *)(uVar35 + 0x30 + lVar31);
          local_1018 = *puVar9;
          uStack_1010 = puVar9[1];
          puVar9 = (undefined8 *)(uVar35 + 0x40 + lVar31);
          local_11f8 = *puVar9;
          uStack_11f0 = puVar9[1];
          fVar133 = *(float *)(ray + k * 4);
          fVar92 = *(float *)(ray + k * 4 + 0x10);
          fVar100 = *(float *)(ray + k * 4 + 0x20);
          fVar135 = *pfVar8 - fVar133;
          fVar136 = *pfVar2 - fVar133;
          fVar137 = *pfVar4 - fVar133;
          fVar138 = *pfVar6 - fVar133;
          local_1028 = pfVar8[1] - fVar92;
          fStack_1024 = pfVar2[1] - fVar92;
          fStack_1020 = pfVar4[1] - fVar92;
          fStack_101c = pfVar6[1] - fVar92;
          local_1068 = pfVar8[2] - fVar100;
          fStack_1064 = pfVar2[2] - fVar100;
          fStack_1060 = pfVar4[2] - fVar100;
          fStack_105c = pfVar6[2] - fVar100;
          fVar62 = *pfVar1 - fVar133;
          fVar69 = *pfVar3 - fVar133;
          fVar70 = *pfVar5 - fVar133;
          fVar71 = *pfVar7 - fVar133;
          fVar72 = pfVar1[1] - fVar92;
          fVar79 = pfVar3[1] - fVar92;
          fVar80 = pfVar5[1] - fVar92;
          fVar81 = pfVar7[1] - fVar92;
          fVar116 = pfVar1[2] - fVar100;
          fVar119 = pfVar3[2] - fVar100;
          fVar121 = pfVar5[2] - fVar100;
          fVar122 = pfVar7[2] - fVar100;
          fVar130 = *pfVar16 - fVar133;
          fVar131 = *pfVar17 - fVar133;
          fVar132 = *pfVar18 - fVar133;
          fVar133 = *pfVar19 - fVar133;
          fVar82 = pfVar16[1] - fVar92;
          fVar90 = pfVar17[1] - fVar92;
          fVar91 = pfVar18[1] - fVar92;
          fVar92 = pfVar19[1] - fVar92;
          fVar93 = pfVar16[2] - fVar100;
          fVar98 = pfVar17[2] - fVar100;
          fVar99 = pfVar18[2] - fVar100;
          fVar100 = pfVar19[2] - fVar100;
          local_1038 = fVar130 - fVar135;
          fStack_1034 = fVar131 - fVar136;
          fStack_1030 = fVar132 - fVar137;
          fStack_102c = fVar133 - fVar138;
          local_1058 = fVar82 - local_1028;
          fStack_1054 = fVar90 - fStack_1024;
          fStack_1050 = fVar91 - fStack_1020;
          fStack_104c = fVar92 - fStack_101c;
          local_1048 = fVar93 - local_1068;
          fStack_1044 = fVar98 - fStack_1064;
          fStack_1040 = fVar99 - fStack_1060;
          fStack_103c = fVar100 - fStack_105c;
          fVar129 = *(float *)(ray + k * 4 + 0x50);
          fVar134 = *(float *)(ray + k * 4 + 0x60);
          fVar139 = *(float *)(ray + k * 4 + 0x40);
          fVar109 = (local_1058 * (fVar93 + local_1068) - (fVar82 + local_1028) * local_1048) *
                    fVar139 + ((fVar130 + fVar135) * local_1048 - (fVar93 + local_1068) * local_1038
                              ) * fVar129 +
                              (local_1038 * (fVar82 + local_1028) - (fVar130 + fVar135) * local_1058
                              ) * fVar134;
          fVar113 = (fStack_1054 * (fVar98 + fStack_1064) - (fVar90 + fStack_1024) * fStack_1044) *
                    fVar139 + ((fVar131 + fVar136) * fStack_1044 -
                              (fVar98 + fStack_1064) * fStack_1034) * fVar129 +
                              (fStack_1034 * (fVar90 + fStack_1024) -
                              (fVar131 + fVar136) * fStack_1054) * fVar134;
          local_10b8._0_8_ = CONCAT44(fVar113,fVar109);
          local_10b8._8_4_ =
               (fStack_1050 * (fVar99 + fStack_1060) - (fVar91 + fStack_1020) * fStack_1040) *
               fVar139 + ((fVar132 + fVar137) * fStack_1040 - (fVar99 + fStack_1060) * fStack_1030)
                         * fVar129 +
                         (fStack_1030 * (fVar91 + fStack_1020) - (fVar132 + fVar137) * fStack_1050)
                         * fVar134;
          local_10b8._12_4_ =
               (fStack_104c * (fVar100 + fStack_105c) - (fVar92 + fStack_101c) * fStack_103c) *
               fVar139 + ((fVar133 + fVar138) * fStack_103c - (fVar100 + fStack_105c) * fStack_102c)
                         * fVar129 +
                         (fStack_102c * (fVar92 + fStack_101c) - (fVar133 + fVar138) * fStack_104c)
                         * fVar134;
          fVar117 = fVar135 - fVar62;
          fVar120 = fVar136 - fVar69;
          fVar141 = fVar137 - fVar70;
          fVar123 = fVar138 - fVar71;
          fVar124 = local_1028 - fVar72;
          fVar126 = fStack_1024 - fVar79;
          fVar127 = fStack_1020 - fVar80;
          fVar128 = fStack_101c - fVar81;
          local_1078 = local_1068 - fVar116;
          fStack_1074 = fStack_1064 - fVar119;
          fStack_1070 = fStack_1060 - fVar121;
          fStack_106c = fStack_105c - fVar122;
          local_1098._0_4_ =
               (fVar124 * (local_1068 + fVar116) - (local_1028 + fVar72) * local_1078) * fVar139 +
               ((fVar135 + fVar62) * local_1078 - (local_1068 + fVar116) * fVar117) * fVar129 +
               (fVar117 * (local_1028 + fVar72) - (fVar135 + fVar62) * fVar124) * fVar134;
          local_1098._4_4_ =
               (fVar126 * (fStack_1064 + fVar119) - (fStack_1024 + fVar79) * fStack_1074) * fVar139
               + ((fVar136 + fVar69) * fStack_1074 - (fStack_1064 + fVar119) * fVar120) * fVar129 +
                 (fVar120 * (fStack_1024 + fVar79) - (fVar136 + fVar69) * fVar126) * fVar134;
          local_1098._8_4_ =
               (fVar127 * (fStack_1060 + fVar121) - (fStack_1020 + fVar80) * fStack_1070) * fVar139
               + ((fVar137 + fVar70) * fStack_1070 - (fStack_1060 + fVar121) * fVar141) * fVar129 +
                 (fVar141 * (fStack_1020 + fVar80) - (fVar137 + fVar70) * fVar127) * fVar134;
          local_1098._12_4_ =
               (fVar128 * (fStack_105c + fVar122) - (fStack_101c + fVar81) * fStack_106c) * fVar139
               + ((fVar138 + fVar71) * fStack_106c - (fStack_105c + fVar122) * fVar123) * fVar129 +
                 (fVar123 * (fStack_101c + fVar81) - (fVar138 + fVar71) * fVar128) * fVar134;
          fVar142 = fVar62 - fVar130;
          fVar144 = fVar69 - fVar131;
          fVar145 = fVar70 - fVar132;
          fVar146 = fVar71 - fVar133;
          fVar101 = fVar72 - fVar82;
          fVar140 = fVar79 - fVar90;
          fVar106 = fVar80 - fVar91;
          fVar107 = fVar81 - fVar92;
          local_1088 = fVar116 - fVar93;
          fStack_1084 = fVar119 - fVar98;
          fStack_1080 = fVar121 - fVar99;
          fStack_107c = fVar122 - fVar100;
          auVar63._0_4_ =
               (fVar101 * (fVar93 + fVar116) - (fVar82 + fVar72) * local_1088) * fVar139 +
               ((fVar130 + fVar62) * local_1088 - (fVar93 + fVar116) * fVar142) * fVar129 +
               (fVar142 * (fVar82 + fVar72) - (fVar130 + fVar62) * fVar101) * fVar134;
          auVar63._4_4_ =
               (fVar140 * (fVar98 + fVar119) - (fVar90 + fVar79) * fStack_1084) * fVar139 +
               ((fVar131 + fVar69) * fStack_1084 - (fVar98 + fVar119) * fVar144) * fVar129 +
               (fVar144 * (fVar90 + fVar79) - (fVar131 + fVar69) * fVar140) * fVar134;
          auVar63._8_4_ =
               (fVar106 * (fVar99 + fVar121) - (fVar91 + fVar80) * fStack_1080) * fVar139 +
               ((fVar132 + fVar70) * fStack_1080 - (fVar99 + fVar121) * fVar145) * fVar129 +
               (fVar145 * (fVar91 + fVar80) - (fVar132 + fVar70) * fVar106) * fVar134;
          auVar63._12_4_ =
               (fVar107 * (fVar100 + fVar122) - (fVar92 + fVar81) * fStack_107c) * fVar139 +
               ((fVar133 + fVar71) * fStack_107c - (fVar100 + fVar122) * fVar146) * fVar129 +
               (fVar146 * (fVar92 + fVar81) - (fVar133 + fVar71) * fVar107) * fVar134;
          local_10a8 = fVar109 + local_1098._0_4_ + auVar63._0_4_;
          fStack_10a4 = fVar113 + local_1098._4_4_ + auVar63._4_4_;
          fStack_10a0 = local_10b8._8_4_ + local_1098._8_4_ + auVar63._8_4_;
          fStack_109c = local_10b8._12_4_ + local_1098._12_4_ + auVar63._12_4_;
          auVar51._8_4_ = local_10b8._8_4_;
          auVar51._0_8_ = local_10b8._0_8_;
          auVar51._12_4_ = local_10b8._12_4_;
          auVar52 = minps(auVar51,local_1098);
          auVar52 = minps(auVar52,auVar63);
          auVar96._8_4_ = local_10b8._8_4_;
          auVar96._0_8_ = local_10b8._0_8_;
          auVar96._12_4_ = local_10b8._12_4_;
          auVar42 = maxps(auVar96,local_1098);
          auVar42 = maxps(auVar42,auVar63);
          fVar133 = ABS(local_10a8) * 1.1920929e-07;
          fVar92 = ABS(fStack_10a4) * 1.1920929e-07;
          fVar100 = ABS(fStack_10a0) * 1.1920929e-07;
          fVar62 = ABS(fStack_109c) * 1.1920929e-07;
          auVar97._4_4_ = -(uint)(auVar42._4_4_ <= fVar92);
          auVar97._0_4_ = -(uint)(auVar42._0_4_ <= fVar133);
          auVar97._8_4_ = -(uint)(auVar42._8_4_ <= fVar100);
          auVar97._12_4_ = -(uint)(auVar42._12_4_ <= fVar62);
          auVar53._4_4_ = -(uint)(-fVar92 <= auVar52._4_4_);
          auVar53._0_4_ = -(uint)(-fVar133 <= auVar52._0_4_);
          auVar53._8_4_ = -(uint)(-fVar100 <= auVar52._8_4_);
          auVar53._12_4_ = -(uint)(-fVar62 <= auVar52._12_4_);
          auVar97 = auVar97 | auVar53;
          iVar28 = movmskps((int)lVar31,auVar97);
          if (iVar28 != 0) {
            auVar125._0_4_ = fVar124 * local_1088 - fVar101 * local_1078;
            auVar125._4_4_ = fVar126 * fStack_1084 - fVar140 * fStack_1074;
            auVar125._8_4_ = fVar127 * fStack_1080 - fVar106 * fStack_1070;
            auVar125._12_4_ = fVar128 * fStack_107c - fVar107 * fStack_106c;
            auVar54._4_4_ = -(uint)(ABS(fVar126 * fStack_1044) < ABS(fVar140 * fStack_1074));
            auVar54._0_4_ = -(uint)(ABS(fVar124 * local_1048) < ABS(fVar101 * local_1078));
            auVar54._8_4_ = -(uint)(ABS(fVar127 * fStack_1040) < ABS(fVar106 * fStack_1070));
            auVar54._12_4_ = -(uint)(ABS(fVar128 * fStack_103c) < ABS(fVar107 * fStack_106c));
            auVar22._4_4_ = fStack_1054 * fStack_1074 - fVar126 * fStack_1044;
            auVar22._0_4_ = local_1058 * local_1078 - fVar124 * local_1048;
            auVar22._8_4_ = fStack_1050 * fStack_1070 - fVar127 * fStack_1040;
            auVar22._12_4_ = fStack_104c * fStack_106c - fVar128 * fStack_103c;
            local_1168 = blendvps(auVar125,auVar22,auVar54);
            auVar115._0_4_ = local_1048 * fVar117 - local_1038 * local_1078;
            auVar115._4_4_ = fStack_1044 * fVar120 - fStack_1034 * fStack_1074;
            auVar115._8_4_ = fStack_1040 * fVar141 - fStack_1030 * fStack_1070;
            auVar115._12_4_ = fStack_103c * fVar123 - fStack_102c * fStack_106c;
            auVar143._0_4_ = fVar142 * local_1078 - fVar117 * local_1088;
            auVar143._4_4_ = fVar144 * fStack_1074 - fVar120 * fStack_1084;
            auVar143._8_4_ = fVar145 * fStack_1070 - fVar141 * fStack_1080;
            auVar143._12_4_ = fVar146 * fStack_106c - fVar123 * fStack_107c;
            auVar55._4_4_ = -(uint)(ABS(fStack_1034 * fStack_1074) < ABS(fVar120 * fStack_1084));
            auVar55._0_4_ = -(uint)(ABS(local_1038 * local_1078) < ABS(fVar117 * local_1088));
            auVar55._8_4_ = -(uint)(ABS(fStack_1030 * fStack_1070) < ABS(fVar141 * fStack_1080));
            auVar55._12_4_ = -(uint)(ABS(fStack_102c * fStack_106c) < ABS(fVar123 * fStack_107c));
            local_1158 = blendvps(auVar143,auVar115,auVar55);
            auVar118._0_4_ = fVar117 * fVar101 - fVar142 * fVar124;
            auVar118._4_4_ = fVar120 * fVar140 - fVar144 * fVar126;
            auVar118._8_4_ = fVar141 * fVar106 - fVar145 * fVar127;
            auVar118._12_4_ = fVar123 * fVar107 - fVar146 * fVar128;
            auVar56._4_4_ = -(uint)(ABS(fVar120 * fStack_1054) < ABS(fVar144 * fVar126));
            auVar56._0_4_ = -(uint)(ABS(fVar117 * local_1058) < ABS(fVar142 * fVar124));
            auVar56._8_4_ = -(uint)(ABS(fVar141 * fStack_1050) < ABS(fVar145 * fVar127));
            auVar56._12_4_ = -(uint)(ABS(fVar123 * fStack_104c) < ABS(fVar146 * fVar128));
            auVar25._4_4_ = fStack_1034 * fVar126 - fVar120 * fStack_1054;
            auVar25._0_4_ = local_1038 * fVar124 - fVar117 * local_1058;
            auVar25._8_4_ = fStack_1030 * fVar127 - fVar141 * fStack_1050;
            auVar25._12_4_ = fStack_102c * fVar128 - fVar123 * fStack_104c;
            local_1148 = blendvps(auVar118,auVar25,auVar56);
            fVar70 = fVar139 * local_1168._0_4_ +
                     fVar129 * local_1158._0_4_ + fVar134 * local_1148._0_4_;
            fVar71 = fVar139 * local_1168._4_4_ +
                     fVar129 * local_1158._4_4_ + fVar134 * local_1148._4_4_;
            fVar72 = fVar139 * local_1168._8_4_ +
                     fVar129 * local_1158._8_4_ + fVar134 * local_1148._8_4_;
            fVar79 = fVar139 * local_1168._12_4_ +
                     fVar129 * local_1158._12_4_ + fVar134 * local_1148._12_4_;
            fVar70 = fVar70 + fVar70;
            fVar71 = fVar71 + fVar71;
            fVar72 = fVar72 + fVar72;
            fVar79 = fVar79 + fVar79;
            auVar57._0_4_ = local_1028 * local_1158._0_4_ + local_1068 * local_1148._0_4_;
            auVar57._4_4_ = fStack_1024 * local_1158._4_4_ + fStack_1064 * local_1148._4_4_;
            auVar57._8_4_ = fStack_1020 * local_1158._8_4_ + fStack_1060 * local_1148._8_4_;
            auVar57._12_4_ = fStack_101c * local_1158._12_4_ + fStack_105c * local_1148._12_4_;
            fVar134 = fVar135 * local_1168._0_4_ + auVar57._0_4_;
            fVar139 = fVar136 * local_1168._4_4_ + auVar57._4_4_;
            fVar62 = fVar137 * local_1168._8_4_ + auVar57._8_4_;
            fVar69 = fVar138 * local_1168._12_4_ + auVar57._12_4_;
            auVar21._4_4_ = fVar71;
            auVar21._0_4_ = fVar70;
            auVar21._8_4_ = fVar72;
            auVar21._12_4_ = fVar79;
            auVar52 = rcpps(auVar57,auVar21);
            fVar133 = auVar52._0_4_;
            fVar92 = auVar52._4_4_;
            fVar100 = auVar52._8_4_;
            fVar129 = auVar52._12_4_;
            fVar134 = ((1.0 - fVar70 * fVar133) * fVar133 + fVar133) * (fVar134 + fVar134);
            fVar139 = ((1.0 - fVar71 * fVar92) * fVar92 + fVar92) * (fVar139 + fVar139);
            fVar100 = ((1.0 - fVar72 * fVar100) * fVar100 + fVar100) * (fVar62 + fVar62);
            fVar129 = ((1.0 - fVar79 * fVar129) * fVar129 + fVar129) * (fVar69 + fVar69);
            fVar92 = *(float *)(ray + k * 4 + 0x80);
            fVar133 = *(float *)(ray + k * 4 + 0x30);
            auVar64._4_4_ = -(uint)(fVar133 <= fVar139);
            auVar64._0_4_ = -(uint)(fVar133 <= fVar134);
            auVar64._8_4_ = -(uint)(fVar133 <= fVar100);
            auVar64._12_4_ = -(uint)(fVar133 <= fVar129);
            auVar58._0_4_ = -(uint)(fVar134 <= fVar92 && fVar133 <= fVar134) & auVar97._0_4_;
            auVar58._4_4_ = -(uint)(fVar139 <= fVar92 && fVar133 <= fVar139) & auVar97._4_4_;
            auVar58._8_4_ = -(uint)(fVar100 <= fVar92 && fVar133 <= fVar100) & auVar97._8_4_;
            auVar58._12_4_ = -(uint)(fVar129 <= fVar92 && fVar133 <= fVar129) & auVar97._12_4_;
            iVar28 = movmskps(iVar28,auVar58);
            if (iVar28 != 0) {
              valid.field_0.i[0] = auVar58._0_4_ & -(uint)(fVar70 != 0.0);
              valid.field_0.i[1] = auVar58._4_4_ & -(uint)(fVar71 != 0.0);
              valid.field_0.i[2] = auVar58._8_4_ & -(uint)(fVar72 != 0.0);
              valid.field_0.i[3] = auVar58._12_4_ & -(uint)(fVar79 != 0.0);
              iVar28 = movmskps(iVar28,(undefined1  [16])valid.field_0);
              if (iVar28 != 0) {
                tNear.field_0.v[2] = local_10b8._8_4_;
                tNear.field_0._0_8_ = local_10b8._0_8_;
                tNear.field_0.v[3] = local_10b8._12_4_;
                auVar26._4_4_ = fStack_10a4;
                auVar26._0_4_ = local_10a8;
                auVar26._8_4_ = fStack_10a0;
                auVar26._12_4_ = fStack_109c;
                local_1178[0] = fVar134;
                local_1178[1] = fVar139;
                local_1178[2] = fVar100;
                local_1178[3] = fVar129;
                auVar52 = rcpps(auVar64,auVar26);
                fVar133 = auVar52._0_4_;
                fVar62 = auVar52._4_4_;
                fVar69 = auVar52._8_4_;
                fVar70 = auVar52._12_4_;
                fVar133 = (float)(-(uint)(1e-18 <= ABS(local_10a8)) &
                                 (uint)(((float)DAT_01f7ba10 - local_10a8 * fVar133) * fVar133 +
                                       fVar133));
                fVar62 = (float)(-(uint)(1e-18 <= ABS(fStack_10a4)) &
                                (uint)((DAT_01f7ba10._4_4_ - fStack_10a4 * fVar62) * fVar62 + fVar62
                                      ));
                fVar69 = (float)(-(uint)(1e-18 <= ABS(fStack_10a0)) &
                                (uint)((DAT_01f7ba10._8_4_ - fStack_10a0 * fVar69) * fVar69 + fVar69
                                      ));
                fVar70 = (float)(-(uint)(1e-18 <= ABS(fStack_109c)) &
                                (uint)((DAT_01f7ba10._12_4_ - fStack_109c * fVar70) * fVar70 +
                                      fVar70));
                auVar112._0_4_ = fVar109 * fVar133;
                auVar112._4_4_ = fVar113 * fVar62;
                auVar112._8_4_ = local_10b8._8_4_ * fVar69;
                auVar112._12_4_ = local_10b8._12_4_ * fVar70;
                local_1198 = minps(auVar112,_DAT_01f7ba10);
                auVar87._0_4_ = fVar133 * local_1098._0_4_;
                auVar87._4_4_ = fVar62 * local_1098._4_4_;
                auVar87._8_4_ = fVar69 * local_1098._8_4_;
                auVar87._12_4_ = fVar70 * local_1098._12_4_;
                local_1188 = minps(auVar87,_DAT_01f7ba10);
                auVar23._4_4_ = fVar139;
                auVar23._0_4_ = fVar134;
                auVar23._8_4_ = fVar100;
                auVar23._12_4_ = fVar129;
                auVar42 = blendvps(_DAT_01f7a9f0,auVar23,(undefined1  [16])valid.field_0);
                auVar88._4_4_ = auVar42._0_4_;
                auVar88._0_4_ = auVar42._4_4_;
                auVar88._8_4_ = auVar42._12_4_;
                auVar88._12_4_ = auVar42._8_4_;
                auVar52 = minps(auVar88,auVar42);
                auVar65._0_8_ = auVar52._8_8_;
                auVar65._8_4_ = auVar52._0_4_;
                auVar65._12_4_ = auVar52._4_4_;
                auVar52 = minps(auVar65,auVar52);
                uVar34 = -(uint)(auVar52._0_4_ == auVar42._0_4_);
                uVar39 = -(uint)(auVar52._4_4_ == auVar42._4_4_);
                uVar40 = -(uint)(auVar52._8_4_ == auVar42._8_4_);
                uVar41 = -(uint)(auVar52._12_4_ == auVar42._12_4_);
                auVar78._4_4_ = uVar39;
                auVar78._0_4_ = uVar34;
                auVar76._0_4_ = uVar34 & valid.field_0.i[0];
                auVar76._4_4_ = uVar39 & valid.field_0.i[1];
                auVar76._8_4_ = uVar40 & valid.field_0.i[2];
                auVar76._12_4_ = uVar41 & valid.field_0.i[3];
                iVar28 = movmskps(iVar28,auVar76);
                auVar77._8_4_ = 0xffffffff;
                auVar77._0_8_ = 0xffffffffffffffff;
                auVar77._12_4_ = 0xffffffff;
                if (iVar28 != 0) {
                  auVar78._8_4_ = uVar40;
                  auVar78._12_4_ = uVar41;
                  auVar77 = auVar78;
                }
                auVar59._0_4_ = valid.field_0.i[0] & auVar77._0_4_;
                auVar59._4_4_ = valid.field_0.i[1] & auVar77._4_4_;
                auVar59._8_4_ = valid.field_0.i[2] & auVar77._8_4_;
                auVar59._12_4_ = valid.field_0.i[3] & auVar77._12_4_;
                uVar29 = movmskps(iVar28,auVar59);
                uVar33 = CONCAT44((int)((ulong)lVar31 >> 0x20),uVar29);
                lVar31 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                  }
                }
LAB_00259253:
                uVar34 = *(uint *)((long)&local_1018 + lVar31 * 4);
                pRVar32 = (RTCRayN *)(ulong)uVar34;
                pGVar20 = (pSVar14->geometries).items[(long)pRVar32].ptr;
                if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar31] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar29 = *(undefined4 *)(local_1198 + lVar31 * 4);
                    fVar133 = local_1178[lVar31 + -4];
                    *(float *)(ray + k * 4 + 0x80) = local_1178[lVar31];
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1168 + lVar31 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1158 + lVar31 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1148 + lVar31 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar29;
                    *(float *)(ray + k * 4 + 0x100) = fVar133;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_11f8 + lVar31 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar34;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_002596e5;
                  }
                  local_fd8 = *(undefined4 *)(local_1198 + lVar31 * 4);
                  local_fc8 = local_1178[lVar31 + -4];
                  uVar29 = *(undefined4 *)(local_1168 + lVar31 * 4);
                  uVar10 = *(undefined4 *)(local_1158 + lVar31 * 4);
                  local_fa8._4_4_ = uVar34;
                  local_fa8._0_4_ = uVar34;
                  local_fa8._8_4_ = uVar34;
                  local_fa8._12_4_ = uVar34;
                  uVar11 = *(undefined4 *)((long)&local_11f8 + lVar31 * 4);
                  local_fb8._4_4_ = uVar11;
                  local_fb8._0_4_ = uVar11;
                  local_fb8._8_4_ = uVar11;
                  local_fb8._12_4_ = uVar11;
                  local_ff8._4_4_ = uVar10;
                  local_ff8._0_4_ = uVar10;
                  local_ff8._8_4_ = uVar10;
                  local_ff8._12_4_ = uVar10;
                  uVar10 = *(undefined4 *)(local_1148 + lVar31 * 4);
                  local_fe8._4_4_ = uVar10;
                  local_fe8._0_4_ = uVar10;
                  local_fe8._8_4_ = uVar10;
                  local_fe8._12_4_ = uVar10;
                  local_1008[0] = (RTCHitN)(char)uVar29;
                  local_1008[1] = (RTCHitN)(char)((uint)uVar29 >> 8);
                  local_1008[2] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
                  local_1008[3] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
                  local_1008[4] = (RTCHitN)(char)uVar29;
                  local_1008[5] = (RTCHitN)(char)((uint)uVar29 >> 8);
                  local_1008[6] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
                  local_1008[7] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
                  local_1008[8] = (RTCHitN)(char)uVar29;
                  local_1008[9] = (RTCHitN)(char)((uint)uVar29 >> 8);
                  local_1008[10] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
                  local_1008[0xb] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
                  local_1008[0xc] = (RTCHitN)(char)uVar29;
                  local_1008[0xd] = (RTCHitN)(char)((uint)uVar29 >> 8);
                  local_1008[0xe] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
                  local_1008[0xf] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
                  uStack_fd4 = local_fd8;
                  uStack_fd0 = local_fd8;
                  uStack_fcc = local_fd8;
                  fStack_fc4 = local_fc8;
                  fStack_fc0 = local_fc8;
                  fStack_fbc = local_fc8;
                  local_f98 = context->user->instID[0];
                  uStack_f94 = local_f98;
                  uStack_f90 = local_f98;
                  uStack_f8c = local_f98;
                  local_f88 = context->user->instPrimID[0];
                  uStack_f84 = local_f88;
                  uStack_f80 = local_f88;
                  uStack_f7c = local_f88;
                  *(float *)(ray + k * 4 + 0x80) = local_1178[lVar31];
                  local_1278 = *local_1268;
                  args.valid = (int *)local_1278;
                  args.geometryUserPtr = pGVar20->userPtr;
                  args.context = context->user;
                  args.hit = local_1008;
                  args.N = 4;
                  pRVar32 = (RTCRayN *)pGVar20->intersectionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar32 != (RTCRayN *)0x0) {
                    pRVar32 = (RTCRayN *)(*(code *)pRVar32)(&args);
                  }
                  if (local_1278 == (undefined1  [16])0x0) {
                    auVar66._8_4_ = 0xffffffff;
                    auVar66._0_8_ = 0xffffffffffffffff;
                    auVar66._12_4_ = 0xffffffff;
                    auVar66 = auVar66 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar32 = (RTCRayN *)context->args->filter;
                    if ((pRVar32 != (RTCRayN *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar32 = (RTCRayN *)(*(code *)pRVar32)(&args);
                    }
                    auVar60._0_4_ = -(uint)(local_1278._0_4_ == 0);
                    auVar60._4_4_ = -(uint)(local_1278._4_4_ == 0);
                    auVar60._8_4_ = -(uint)(local_1278._8_4_ == 0);
                    auVar60._12_4_ = -(uint)(local_1278._12_4_ == 0);
                    auVar66 = auVar60 ^ _DAT_01f7ae20;
                    if (local_1278 != (undefined1  [16])0x0) {
                      auVar52 = blendvps(*(undefined1 (*) [16])args.hit,
                                         *(undefined1 (*) [16])(args.ray + 0xc0),auVar60);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar52;
                      auVar52 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                         *(undefined1 (*) [16])(args.ray + 0xd0),auVar60);
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar52;
                      auVar52 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                         *(undefined1 (*) [16])(args.ray + 0xe0),auVar60);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar52;
                      auVar52 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                         *(undefined1 (*) [16])(args.ray + 0xf0),auVar60);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar52;
                      auVar52 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                         *(undefined1 (*) [16])(args.ray + 0x100),auVar60);
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar52;
                      auVar52 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                         *(undefined1 (*) [16])(args.ray + 0x110),auVar60);
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar52;
                      auVar52 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                         *(undefined1 (*) [16])(args.ray + 0x120),auVar60);
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar52;
                      auVar52 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                         *(undefined1 (*) [16])(args.ray + 0x130),auVar60);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar52;
                      auVar52 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                         *(undefined1 (*) [16])(args.ray + 0x140),auVar60);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar52;
                      pRVar32 = args.ray;
                    }
                  }
                  if ((_DAT_01f7bb20 & auVar66) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar92;
                  }
                  else {
                    fVar92 = *(float *)(ray + k * 4 + 0x80);
                  }
                  valid.field_0.v[lVar31] = 0.0;
                  valid.field_0.i[0] = -(uint)(fVar134 <= fVar92) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar139 <= fVar92) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar100 <= fVar92) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar129 <= fVar92) & valid.field_0.i[3];
                }
                iVar28 = movmskps((int)pRVar32,(undefined1  [16])valid.field_0);
                if (iVar28 == 0) goto LAB_002596e5;
                auVar24._4_4_ = fVar139;
                auVar24._0_4_ = fVar134;
                auVar24._8_4_ = fVar100;
                auVar24._12_4_ = fVar129;
                auVar42 = blendvps(_DAT_01f7a9f0,auVar24,(undefined1  [16])valid.field_0);
                auVar89._4_4_ = auVar42._0_4_;
                auVar89._0_4_ = auVar42._4_4_;
                auVar89._8_4_ = auVar42._12_4_;
                auVar89._12_4_ = auVar42._8_4_;
                auVar52 = minps(auVar89,auVar42);
                auVar67._0_8_ = auVar52._8_8_;
                auVar67._8_4_ = auVar52._0_4_;
                auVar67._12_4_ = auVar52._4_4_;
                auVar52 = minps(auVar67,auVar52);
                auVar68._0_8_ =
                     CONCAT44(-(uint)(auVar52._4_4_ == auVar42._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar52._0_4_ == auVar42._0_4_) & valid.field_0._0_4_);
                auVar68._8_4_ = -(uint)(auVar52._8_4_ == auVar42._8_4_) & valid.field_0._8_4_;
                auVar68._12_4_ = -(uint)(auVar52._12_4_ == auVar42._12_4_) & valid.field_0._12_4_;
                iVar28 = movmskps(iVar28,auVar68);
                aVar61 = valid.field_0;
                if (iVar28 != 0) {
                  aVar61.i[2] = auVar68._8_4_;
                  aVar61._0_8_ = auVar68._0_8_;
                  aVar61.i[3] = auVar68._12_4_;
                }
                uVar29 = movmskps(iVar28,(undefined1  [16])aVar61);
                uVar33 = CONCAT44((int)((ulong)pRVar32 >> 0x20),uVar29);
                lVar31 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                  }
                }
                goto LAB_00259253;
              }
            }
          }
LAB_002596e5:
          local_1258 = local_1258 + 1;
        } while (local_1258 != local_1260);
      }
      uVar29 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar52._4_4_ = uVar29;
      auVar52._0_4_ = uVar29;
      auVar52._8_4_ = uVar29;
      auVar52._12_4_ = uVar29;
      fVar62 = local_10c8;
      fVar69 = fStack_10c4;
      fVar70 = fStack_10c0;
      fVar133 = fStack_10bc;
      fVar71 = local_10f8;
      fVar72 = fStack_10f4;
      fVar79 = fStack_10f0;
      fVar129 = fStack_10ec;
      fVar80 = local_1108;
      fVar81 = fStack_1104;
      fVar82 = fStack_1100;
      fVar134 = fStack_10fc;
      fVar90 = local_1118;
      fVar91 = fStack_1114;
      fVar93 = fStack_1110;
      fVar139 = fStack_110c;
      fVar98 = local_1128;
      fVar99 = fStack_1124;
      fVar101 = fStack_1120;
      fVar140 = fStack_111c;
      fVar106 = local_10d8;
      fVar107 = fStack_10d4;
      fVar109 = fStack_10d0;
      fVar92 = fStack_10cc;
      fVar113 = local_10e8;
      fVar116 = fStack_10e4;
      fVar117 = fStack_10e0;
      fVar100 = fStack_10dc;
      fVar119 = local_1138;
      fVar120 = fStack_1134;
      fVar121 = fStack_1130;
      fVar141 = fStack_112c;
    }
    if (pSVar30 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }